

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O0

t_int * scalarover_perform(t_int *w)

{
  int local_2c;
  float *pfStack_28;
  int n;
  t_sample *out;
  float *pfStack_18;
  t_float f;
  t_sample *in;
  t_int *w_local;
  
  pfStack_18 = (float *)w[1];
  out._4_4_ = *(float *)w[2];
  pfStack_28 = (float *)w[3];
  local_2c = (int)w[4];
  if ((out._4_4_ != 0.0) || (NAN(out._4_4_))) {
    out._4_4_ = 1.0 / out._4_4_;
  }
  while (local_2c != 0) {
    *pfStack_28 = *pfStack_18 * out._4_4_;
    local_2c = local_2c + -1;
    pfStack_28 = pfStack_28 + 1;
    pfStack_18 = pfStack_18 + 1;
  }
  return w + 5;
}

Assistant:

t_int *scalarover_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_float f = *(t_float *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    if(f) f = 1./f;
    while (n--) *out++ = *in++ * f;
    return (w+5);
}